

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

void eatspecial(void)

{
  obj *otmp_00;
  boolean bVar1;
  char *line;
  bool bVar2;
  obj *otmp;
  
  otmp_00 = victual.piece;
  set_occupation(eatfood,"eating non-food",0);
  lesshungry(victual.nmod);
  occupation = (_func_int *)0x0;
  victual.piece = (obj *)0x0;
  victual._20_1_ = victual._20_1_ & 0xfb;
  if (otmp_00->oclass == '\f') {
    if (otmp_00->where == '\0') {
      dealloc_obj(otmp_00);
    }
    else {
      useupf(otmp_00,(long)otmp_00->quan);
    }
  }
  else {
    if (otmp_00->oclass == '\b') {
      otmp_00->quan = otmp_00->quan + 1;
      dopotion(otmp_00);
    }
    if ((otmp_00->oclass == '\x04') || (otmp_00->oclass == '\x05')) {
      eataccessory(otmp_00);
    }
    else if ((otmp_00->otyp == 0xf1) && (otmp_00->corpsenm != 0)) {
      o_unleash(otmp_00);
    }
    if ((otmp_00->otyp == 0x10) && ((*(uint *)&otmp_00->field_0x4a & 1) == 0)) {
      bVar2 = false;
      if (u.uprops[0x23].intrinsic != 0) {
        bVar2 = true;
        if ((u.uprops[0x24].extrinsic == 0) && (bVar2 = false, u.umonnum != u.umonster)) {
          bVar1 = dmgtype(youmonst.data,0x24);
          bVar2 = bVar1 != '\0';
        }
        bVar2 = (bool)(bVar2 ^ 1);
      }
      line = "That was pure chewing satisfaction!";
      if (bVar2) {
        line = "Four out of five dentists agree.";
      }
      pline(line);
      exercise(2,'\x01');
    }
    if ((otmp_00->otyp == 0x212) && ((*(uint *)&otmp_00->field_0x4a & 1) == 0)) {
      pline("Yabba-dabba delicious!");
      exercise(4,'\x01');
    }
    if ((otmp_00 == uwep) && (otmp_00->quan == 1)) {
      uwepgone();
    }
    if ((otmp_00 == uquiver) && (otmp_00->quan == 1)) {
      uqwepgone();
    }
    if ((otmp_00 == uswapwep) && (otmp_00->quan == 1)) {
      uswapwepgone();
    }
    if (otmp_00 == uball) {
      unpunish();
    }
    if (otmp_00 == uchain) {
      unpunish();
    }
    else if (otmp_00->where == '\x03') {
      useup(otmp_00);
    }
    else {
      useupf(otmp_00,1);
    }
  }
  return;
}

Assistant:

static void eatspecial(void) /* called after eating non-food */
{
	struct obj *otmp = victual.piece;

	/* lesshungry wants an occupation to handle choke messages correctly */
	set_occupation(eatfood, "eating non-food", 0);
	lesshungry(victual.nmod);
	occupation = 0;
	victual.piece = NULL;
	victual.eating = 0;
	if (otmp->oclass == COIN_CLASS) {
		if (otmp->where == OBJ_FREE)
		    dealloc_obj(otmp);
		else
		    useupf(otmp, otmp->quan);
		return;
	}
	if (otmp->oclass == POTION_CLASS) {
		otmp->quan++; /* dopotion() does a useup() */
		dopotion(otmp);
	}
	if (otmp->oclass == RING_CLASS || otmp->oclass == AMULET_CLASS)
		eataccessory(otmp);
	else if (otmp->otyp == LEASH && otmp->leashmon)
		o_unleash(otmp);

	/* KMH -- idea by "Tommy the Terrorist" */
	if ((otmp->otyp == TRIDENT) && !otmp->cursed)
	{
		pline(Hallucination ? "Four out of five dentists agree." :
				"That was pure chewing satisfaction!");
		exercise(A_WIS, TRUE);
	}
	if ((otmp->otyp == FLINT) && !otmp->cursed)
	{
		pline("Yabba-dabba delicious!");
		exercise(A_CON, TRUE);
	}

	if (otmp == uwep && otmp->quan == 1L) uwepgone();
	if (otmp == uquiver && otmp->quan == 1L) uqwepgone();
	if (otmp == uswapwep && otmp->quan == 1L) uswapwepgone();

	if (otmp == uball) unpunish();
	if (otmp == uchain) unpunish(); /* but no useup() */
	else if (carried(otmp)) useup(otmp);
	else useupf(otmp, 1L);
}